

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

error_code __thiscall
anon_unknown.dwarf_1352d2::DirectoryContentsTask::getContents
          (DirectoryContentsTask *this,StringRef path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  long lVar1;
  long lVar2;
  StringRef path_00;
  bool bVar3;
  int iVar4;
  storage_type *status;
  directory_iterator *pdVar5;
  undefined8 extraout_RAX;
  ulong uVar6;
  undefined8 extraout_RAX_00;
  undefined8 uVar7;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  error_category *peVar8;
  error_category *extraout_RDX_01;
  error_category *extraout_RDX_02;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  long lVar9;
  error_code eVar10;
  directory_iterator it;
  StringRef path_local;
  error_code ec;
  StringRef local_170;
  directory_iterator local_158;
  SmallString<256U> resolvedPath;
  
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)path.Length;
  path_local.Length = (size_t)path.Data;
  ec._M_value = 0;
  path_local.Data = (char *)this;
  ec._M_cat = (error_category *)std::_V2::system_category();
  llvm::Twine::Twine((Twine *)&resolvedPath,&path_local);
  llvm::sys::fs::directory_iterator::directory_iterator(&it,(Twine *)&resolvedPath,&ec,false);
  local_158.State.
  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_158.State.
  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_158.FollowSymlinks = true;
  local_158._17_7_ = 0;
  do {
    bVar3 = llvm::sys::fs::directory_iterator::operator!=(&it,&local_158);
    if ((!bVar3) || (ec._M_value != 0)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_158.State.
                  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&it.State.
                  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      lVar1 = *(long *)this_00;
      lVar2 = *(long *)(this_00 + 8);
      uVar7 = extraout_RAX;
      peVar8 = extraout_RDX;
      if (lVar1 != lVar2) {
        uVar6 = lVar2 - lVar1 >> 5;
        lVar9 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DirectoryContentsTask::getContents(llvm::StringRef,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                  (lVar1,lVar2,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar2 - lVar1 < 0x201) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DirectoryContentsTask::getContents(llvm::StringRef,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                    (lVar1,lVar2);
          uVar7 = extraout_RAX_02;
          peVar8 = extraout_RDX_02;
        }
        else {
          lVar9 = lVar1 + 0x200;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DirectoryContentsTask::getContents(llvm::StringRef,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                    (lVar1,lVar9);
          uVar7 = extraout_RAX_00;
          peVar8 = extraout_RDX_00;
          for (; lVar9 != lVar2; lVar9 = lVar9 + 0x20) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::DirectoryContentsTask::getContents(llvm::StringRef,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                      (lVar9);
            uVar7 = extraout_RAX_01;
            peVar8 = extraout_RDX_01;
          }
        }
      }
      eVar10._M_cat = peVar8;
      eVar10._0_8_ = uVar7;
      return eVar10;
    }
    llvm::sys::fs::directory_entry::status
              ((ErrorOr<llvm::sys::fs::basic_file_status> *)&resolvedPath,
               &(it.State.
                 super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->CurrentEntry);
    status = llvm::ErrorOr<llvm::sys::fs::basic_file_status>::getStorage
                       ((ErrorOr<llvm::sys::fs::basic_file_status> *)&resolvedPath);
    bVar3 = llvm::sys::fs::is_symlink_file(status);
    llvm::ErrorOr<llvm::sys::fs::basic_file_status>::~ErrorOr
              ((ErrorOr<llvm::sys::fs::basic_file_status> *)&resolvedPath);
    if (bVar3) {
      resolvedPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX =
           &resolvedPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
      resolvedPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = 0;
      resolvedPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity = 0x100;
      llvm::Twine::Twine((Twine *)&local_170,
                         &((it.State.
                            super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->CurrentEntry).Path);
      eVar10 = llvm::sys::fs::real_path
                         ((Twine *)&local_170,(SmallVectorImpl<char> *)&resolvedPath,false);
      if ((eVar10._M_value != 0) ||
         (uVar6 = resolvedPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                  super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                  0xffffffff, path_local.Length < uVar6)) {
LAB_00152b77:
        llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&resolvedPath);
        goto LAB_00152b7f;
      }
      if (uVar6 != 0) {
        iVar4 = bcmp(path_local.Data,
                     resolvedPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,uVar6)
        ;
        if (iVar4 != 0) goto LAB_00152b77;
      }
      llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&resolvedPath);
    }
    else {
LAB_00152b7f:
      path_00.Data = ((it.State.
                       super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->CurrentEntry).Path._M_dataplus._M_p;
      path_00.Length =
           ((it.State.
             super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->CurrentEntry).Path._M_string_length;
      local_170 = llvm::sys::path::filename(path_00,native);
      llvm::StringRef::str_abi_cxx11_((string *)&resolvedPath,&local_170);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(this_00,(string *)&resolvedPath);
      std::__cxx11::string::_M_dispose();
    }
    pdVar5 = llvm::sys::fs::directory_iterator::increment(&it,&ec);
    llvm::sys::fs::directory_iterator::operator=(&it,pdVar5);
  } while( true );
}

Assistant:

static std::error_code getContents(StringRef path, std::vector<std::string>& filenames) {
    // Get the list of files in the directory.
    // FIXME: This is not going through the filesystem object. Indeed the fs
    // object does not currently support directory listing/iteration, but
    // probably should so that clients may override it.
    //
    // Exit the loop if we encounter any errors, to prevent infinitely looping
    // over an invalid directory in some circumstances. rdar://101717159
    std::error_code ec;
    for (auto it = llvm::sys::fs::directory_iterator(path, ec, /*follow_symlinks */false),
         end = llvm::sys::fs::directory_iterator(); it != end && !ec;
         it = it.increment(ec)) {
      // If this is a symlink to a parent directory, exclude it from results so we don't get stuck in a loop.
      if (llvm::sys::fs::is_symlink_file(*it->status())) {
        SmallString<256> resolvedPath;
        if (!llvm::sys::fs::real_path(it->path(), resolvedPath)) {
          if (path.startswith(resolvedPath)) {
            continue;
          }
        }
      }
      filenames.push_back(llvm::sys::path::filename(it->path()));
    }

    // Order the filenames.
    std::sort(filenames.begin(), filenames.end(),
              [](const std::string& a, const std::string& b) {
                return a < b;
              });

    return ec;
  }